

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_obj_to_desc(JSContext *ctx,JSPropertyDescriptor *d,JSValue desc)

{
  JSValue val_00;
  JSValue val_01;
  JSValue val_02;
  JSValue obj;
  JSValue obj_00;
  JSValue obj_01;
  JSValue obj_02;
  JSValue obj_03;
  JSValue obj_04;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue this_obj_01;
  JSValue this_obj_02;
  JSValue this_obj_03;
  JSValue this_obj_04;
  JSValue obj_05;
  JSValue obj_06;
  JSValue obj_07;
  JSValue obj_08;
  JSValue obj_09;
  JSValue obj_10;
  int iVar1;
  int64_t in_RCX;
  JSValueUnion in_RDX;
  undefined4 *in_RSI;
  JSValueUnion in_RDI;
  JSValue JVar2;
  JSValue prop_2;
  JSValue prop_1;
  JSValue prop;
  int flags;
  JSValue setter;
  JSValue getter;
  JSValue val;
  JSContext *in_stack_fffffffffffffdb0;
  JSValue in_stack_fffffffffffffdb8;
  JSContext *in_stack_fffffffffffffdd8;
  JSValueUnion in_stack_fffffffffffffde0;
  int64_t in_stack_fffffffffffffde8;
  JSAtom in_stack_fffffffffffffe24;
  JSValueUnion in_stack_fffffffffffffe28;
  JSValueUnion in_stack_fffffffffffffe30;
  JSValueUnion in_stack_fffffffffffffe38;
  uint uStack_1b4;
  uint uStack_1a4;
  uint uStack_194;
  byte bVar3;
  byte bVar4;
  undefined2 uVar5;
  JSValueUnion local_170;
  int64_t local_168;
  JSValueUnion local_160;
  int64_t local_158;
  JSValueUnion local_150;
  int64_t local_148;
  undefined8 in_stack_fffffffffffffef8;
  JSAtom prop_00;
  JSContext *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  JSValueUnion in_stack_ffffffffffffff18;
  JSValueUnion in_stack_ffffffffffffff20;
  JSValueUnion local_d0;
  int64_t local_c8;
  JSValueUnion local_a0;
  int64_t local_98;
  BOOL in_stack_ffffffffffffffa0;
  JSValueUnion local_40;
  JSValueUnion local_38;
  JSValueUnion local_10;
  
  prop_00 = (JSAtom)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  JVar2.tag = in_RCX;
  JVar2.u.ptr = in_RDX.ptr;
  iVar1 = JS_IsObject(JVar2);
  if (iVar1 == 0) {
    JS_ThrowTypeErrorNotAnObject((JSContext *)0x17c77e);
    return -1;
  }
  bVar3 = 0;
  bVar4 = 0;
  uVar5 = 0;
  local_150.ptr = (void *)((ulong)uStack_194 << 0x20);
  local_148 = 3;
  local_160.ptr = (void *)((ulong)uStack_1a4 << 0x20);
  local_158 = 3;
  local_170.ptr = (void *)((ulong)uStack_1b4 << 0x20);
  local_168 = 3;
  obj.tag = (int64_t)in_stack_fffffffffffffe38.ptr;
  obj.u.ptr = in_stack_fffffffffffffe30.ptr;
  iVar1 = JS_HasProperty((JSContext *)in_stack_fffffffffffffe28.ptr,obj,in_stack_fffffffffffffe24);
  local_40 = in_stack_fffffffffffffe28;
  local_38 = in_stack_fffffffffffffe30;
  if (iVar1 != 0) {
    obj_05.tag = (int64_t)in_stack_ffffffffffffff20.ptr;
    obj_05.u.ptr = in_stack_ffffffffffffff18.ptr;
    this_obj.tag._0_4_ = in_stack_ffffffffffffff10;
    this_obj.u.ptr = (void *)in_stack_ffffffffffffff08;
    this_obj.tag._4_4_ = in_stack_ffffffffffffff14;
    JVar2 = JS_GetPropertyInternal
                      (in_stack_ffffffffffffff00,obj_05,prop_00,this_obj,in_stack_ffffffffffffffa0);
    local_10 = JVar2.u;
    iVar1 = JS_IsException(JVar2);
    if (iVar1 != 0) goto LAB_0017d070;
    bVar4 = bVar4 | 1;
    val_00.tag = in_stack_fffffffffffffde8;
    val_00.u.float64 = in_stack_fffffffffffffde0.float64;
    iVar1 = JS_ToBoolFree(in_stack_fffffffffffffdd8,val_00);
    local_40 = in_stack_fffffffffffffe28;
    local_38 = in_stack_fffffffffffffe30;
    in_stack_fffffffffffffe38 = local_10;
    if (iVar1 != 0) {
      bVar3 = bVar3 | 1;
    }
  }
  obj_00.tag = (int64_t)in_stack_fffffffffffffe38.ptr;
  obj_00.u.ptr = local_38.ptr;
  iVar1 = JS_HasProperty((JSContext *)local_40.ptr,obj_00,in_stack_fffffffffffffe24);
  if (iVar1 != 0) {
    obj_06.tag = (int64_t)in_stack_ffffffffffffff20.ptr;
    obj_06.u.ptr = in_stack_ffffffffffffff18.ptr;
    this_obj_00.tag._0_4_ = in_stack_ffffffffffffff10;
    this_obj_00.u.ptr = (void *)in_stack_ffffffffffffff08;
    this_obj_00.tag._4_4_ = in_stack_ffffffffffffff14;
    JVar2 = JS_GetPropertyInternal
                      (in_stack_ffffffffffffff00,obj_06,prop_00,this_obj_00,
                       in_stack_ffffffffffffffa0);
    local_40 = JVar2.u;
    local_38 = (JSValueUnion)JVar2.tag;
    iVar1 = JS_IsException(JVar2);
    if (iVar1 != 0) goto LAB_0017d070;
    bVar4 = bVar4 | 2;
    val_01.tag = in_stack_fffffffffffffde8;
    val_01.u.float64 = in_stack_fffffffffffffde0.float64;
    iVar1 = JS_ToBoolFree(in_stack_fffffffffffffdd8,val_01);
    if (iVar1 != 0) {
      bVar3 = bVar3 | 2;
    }
  }
  obj_01.tag = (int64_t)in_stack_fffffffffffffe38.ptr;
  obj_01.u.ptr = local_38.ptr;
  iVar1 = JS_HasProperty((JSContext *)local_40.ptr,obj_01,in_stack_fffffffffffffe24);
  if (iVar1 != 0) {
    obj_07.tag = (int64_t)in_stack_ffffffffffffff20.ptr;
    obj_07.u.ptr = in_stack_ffffffffffffff18.ptr;
    this_obj_01.tag._0_4_ = in_stack_ffffffffffffff10;
    this_obj_01.u.ptr = (void *)in_stack_ffffffffffffff08;
    this_obj_01.tag._4_4_ = in_stack_ffffffffffffff14;
    JVar2 = JS_GetPropertyInternal
                      (in_stack_ffffffffffffff00,obj_07,prop_00,this_obj_01,
                       in_stack_ffffffffffffffa0);
    in_stack_fffffffffffffe24 = JVar2.tag._4_4_;
    iVar1 = JS_IsException(JVar2);
    if (iVar1 != 0) goto LAB_0017d070;
    bVar4 = bVar4 | 4;
    val_02.tag = in_stack_fffffffffffffde8;
    val_02.u.float64 = in_stack_fffffffffffffde0.float64;
    iVar1 = JS_ToBoolFree(in_stack_fffffffffffffdd8,val_02);
    if (iVar1 != 0) {
      bVar3 = bVar3 | 4;
    }
  }
  obj_02.tag = (int64_t)in_stack_fffffffffffffe38.ptr;
  obj_02.u.ptr = local_38.ptr;
  iVar1 = JS_HasProperty((JSContext *)local_40.ptr,obj_02,in_stack_fffffffffffffe24);
  if (iVar1 != 0) {
    bVar4 = bVar4 | 0x20;
    obj_08.tag = (int64_t)in_stack_ffffffffffffff20.ptr;
    obj_08.u.ptr = in_stack_ffffffffffffff18.ptr;
    this_obj_02.tag._0_4_ = in_stack_ffffffffffffff10;
    this_obj_02.u.ptr = (void *)in_stack_ffffffffffffff08;
    this_obj_02.tag._4_4_ = in_stack_ffffffffffffff14;
    JVar2 = JS_GetPropertyInternal
                      (in_stack_ffffffffffffff00,obj_08,prop_00,this_obj_02,
                       in_stack_ffffffffffffffa0);
    local_a0 = JVar2.u;
    local_98 = JVar2.tag;
    local_150 = local_a0;
    local_148 = local_98;
    iVar1 = JS_IsException(JVar2);
    if (iVar1 != 0) goto LAB_0017d070;
  }
  obj_03.tag = (int64_t)in_stack_fffffffffffffe38.ptr;
  obj_03.u.ptr = local_38.ptr;
  iVar1 = JS_HasProperty((JSContext *)local_40.ptr,obj_03,in_stack_fffffffffffffe24);
  if (iVar1 != 0) {
    bVar4 = bVar4 | 8;
    in_stack_ffffffffffffff14 = 0x41;
    obj_09.tag = (int64_t)in_RDX.ptr;
    obj_09.u.float64 = in_RDI.float64;
    this_obj_03.tag._0_4_ = in_stack_ffffffffffffff10;
    this_obj_03.u.ptr = (void *)in_stack_ffffffffffffff08;
    this_obj_03.tag._4_4_ = 0x41;
    in_stack_ffffffffffffff18 = in_RDI;
    JVar2 = JS_GetPropertyInternal
                      (in_stack_ffffffffffffff00,obj_09,prop_00,this_obj_03,
                       in_stack_ffffffffffffffa0);
    local_d0 = JVar2.u;
    local_c8 = JVar2.tag;
    local_160 = local_d0;
    local_158 = local_c8;
    iVar1 = JS_IsException(JVar2);
    if ((iVar1 != 0) ||
       ((iVar1 = JS_IsUndefined(JVar2), in_stack_ffffffffffffff20 = in_RDX, iVar1 == 0 &&
        (iVar1 = JS_IsFunction((JSContext *)in_RDI.ptr,JVar2), in_stack_ffffffffffffff20 = in_RDX,
        iVar1 == 0)))) {
      JS_ThrowTypeError((JSContext *)in_RDI.ptr,"invalid getter");
      goto LAB_0017d070;
    }
  }
  obj_04.tag = (int64_t)in_stack_fffffffffffffe38.ptr;
  obj_04.u.ptr = local_38.ptr;
  iVar1 = JS_HasProperty((JSContext *)local_40.ptr,obj_04,in_stack_fffffffffffffe24);
  if (iVar1 != 0) {
    bVar4 = bVar4 | 0x10;
    obj_10.tag = (int64_t)in_stack_ffffffffffffff20.ptr;
    obj_10.u.float64 = in_stack_ffffffffffffff18.float64;
    this_obj_04.tag._0_4_ = in_stack_ffffffffffffff10;
    this_obj_04.u.ptr = (void *)in_stack_ffffffffffffff08;
    this_obj_04.tag._4_4_ = in_stack_ffffffffffffff14;
    JVar2 = JS_GetPropertyInternal
                      (in_stack_ffffffffffffff00,obj_10,(JSAtom)((ulong)in_RCX >> 0x20),this_obj_04,
                       in_stack_ffffffffffffffa0);
    local_170 = JVar2.u;
    local_168 = JVar2.tag;
    iVar1 = JS_IsException(JVar2);
    if ((iVar1 != 0) ||
       ((iVar1 = JS_IsUndefined(JVar2), iVar1 == 0 &&
        (iVar1 = JS_IsFunction((JSContext *)in_RDI.ptr,JVar2), iVar1 == 0)))) {
      JS_ThrowTypeError((JSContext *)in_RDI.ptr,"invalid setter");
      goto LAB_0017d070;
    }
  }
  if (((bVar4 & 0x18) == 0) || ((bVar4 & 0x22) == 0)) {
    *in_RSI = CONCAT22(uVar5,CONCAT11(bVar4,bVar3));
    ((JSValueUnion *)(in_RSI + 2))->ptr = (void *)local_150;
    *(int64_t *)(in_RSI + 4) = local_148;
    ((JSValueUnion *)(in_RSI + 6))->ptr = (void *)local_160;
    *(int64_t *)(in_RSI + 8) = local_158;
    ((JSValueUnion *)(in_RSI + 10))->ptr = (void *)local_170;
    *(int64_t *)(in_RSI + 0xc) = local_168;
    return 0;
  }
  in_stack_fffffffffffffdb8 =
       JS_ThrowTypeError((JSContext *)in_RDI.ptr,"cannot have setter/getter and value or writable");
LAB_0017d070:
  JS_FreeValue(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8);
  JS_FreeValue(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8);
  JS_FreeValue(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8);
  return -1;
}

Assistant:

static int js_obj_to_desc(JSContext *ctx, JSPropertyDescriptor *d,
                          JSValueConst desc)
{
    JSValue val, getter, setter;
    int flags;

    if (!JS_IsObject(desc)) {
        JS_ThrowTypeErrorNotAnObject(ctx);
        return -1;
    }
    flags = 0;
    val = JS_UNDEFINED;
    getter = JS_UNDEFINED;
    setter = JS_UNDEFINED;
    if (JS_HasProperty(ctx, desc, JS_ATOM_configurable)) {
        JSValue prop = JS_GetProperty(ctx, desc, JS_ATOM_configurable);
        if (JS_IsException(prop))
            goto fail;
        flags |= JS_PROP_HAS_CONFIGURABLE;
        if (JS_ToBoolFree(ctx, prop))
            flags |= JS_PROP_CONFIGURABLE;
    }
    if (JS_HasProperty(ctx, desc, JS_ATOM_writable)) {
        JSValue prop = JS_GetProperty(ctx, desc, JS_ATOM_writable);
        if (JS_IsException(prop))
            goto fail;
        flags |= JS_PROP_HAS_WRITABLE;
        if (JS_ToBoolFree(ctx, prop))
            flags |= JS_PROP_WRITABLE;
    }
    if (JS_HasProperty(ctx, desc, JS_ATOM_enumerable)) {
        JSValue prop = JS_GetProperty(ctx, desc, JS_ATOM_enumerable);
        if (JS_IsException(prop))
            goto fail;
        flags |= JS_PROP_HAS_ENUMERABLE;
        if (JS_ToBoolFree(ctx, prop))
            flags |= JS_PROP_ENUMERABLE;
    }
    if (JS_HasProperty(ctx, desc, JS_ATOM_value)) {
        flags |= JS_PROP_HAS_VALUE;
        val = JS_GetProperty(ctx, desc, JS_ATOM_value);
        if (JS_IsException(val))
            goto fail;
    }
    if (JS_HasProperty(ctx, desc, JS_ATOM_get)) {
        flags |= JS_PROP_HAS_GET;
        getter = JS_GetProperty(ctx, desc, JS_ATOM_get);
        if (JS_IsException(getter) ||
            !(JS_IsUndefined(getter) || JS_IsFunction(ctx, getter))) {
            JS_ThrowTypeError(ctx, "invalid getter");
            goto fail;
        }
    }
    if (JS_HasProperty(ctx, desc, JS_ATOM_set)) {
        flags |= JS_PROP_HAS_SET;
        setter = JS_GetProperty(ctx, desc, JS_ATOM_set);
        if (JS_IsException(setter) ||
            !(JS_IsUndefined(setter) || JS_IsFunction(ctx, setter))) {
            JS_ThrowTypeError(ctx, "invalid setter");
            goto fail;
        }
    }
    if ((flags & (JS_PROP_HAS_SET | JS_PROP_HAS_GET)) &&
        (flags & (JS_PROP_HAS_VALUE | JS_PROP_HAS_WRITABLE))) {
        JS_ThrowTypeError(ctx, "cannot have setter/getter and value or writable");
        goto fail;
    }
    d->flags = flags;
    d->value = val;
    d->getter = getter;
    d->setter = setter;
    return 0;
 fail:
    JS_FreeValue(ctx, val);
    JS_FreeValue(ctx, getter);
    JS_FreeValue(ctx, setter);
    return -1;
}